

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O0

void __thiscall lf::refinement::MeshHierarchy::initGeometryInParent(MeshHierarchy *this)

{
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  source_loc loc_03;
  source_loc loc_04;
  source_loc loc_05;
  source_loc loc_06;
  format_string_t<const_lf::base::RefEl_&> fmt;
  format_string_t<const_lf::base::RefEl_&,_const_Eigen::Matrix<double,__1,__1>_&> fmt_00;
  format_string_t<const_lf::base::RefEl_&,_const_Eigen::Matrix<double,__1,__1>_&> fmt_01;
  format_string_t<const_lf::base::RefEl_&,_const_Eigen::Matrix<double,__1,__1>_&> fmt_02;
  format_string_t<const_lf::base::RefEl_&,_const_Eigen::Matrix<double,__1,__1>_&> fmt_03;
  format_string_t<const_lf::base::RefEl_&,_const_Eigen::Matrix<double,__1,__1>_&> fmt_04;
  format_string_t<const_lf::base::RefEl_&,_const_Eigen::Matrix<double,__1,__1>_&> fmt_05;
  format_string_t<const_unsigned_int_&> fmt_06;
  bool bVar1;
  RefElType RVar2;
  RefElType RVar3;
  int iVar4;
  size_type sVar5;
  __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var6;
  element_type *peVar7;
  __shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var8;
  element_type *peVar9;
  element_type *peVar10;
  reference this_00;
  reference this_01;
  reference this_02;
  undefined4 extraout_var;
  reference ppEVar11;
  reference pvVar12;
  ulong uVar13;
  reference pvVar14;
  size_type sVar15;
  Index IVar16;
  const_reference pvVar17;
  ostream *poVar18;
  runtime_error *prVar19;
  string local_46b0;
  allocator<char> local_4689;
  string local_4688;
  allocator<char> local_4661;
  string local_4660;
  stringstream local_4640 [8];
  stringstream ss_27;
  ostream local_4630 [376];
  Matrix<double,__1,__1,_0,__1,__1> local_44b8;
  source_loc local_44a0;
  string local_4488;
  allocator<char> local_4461;
  string local_4460;
  allocator<char> local_4439;
  string local_4438;
  stringstream local_4418 [8];
  stringstream ss_26;
  ostream local_4408 [376];
  Matrix<double,__1,__1,_0,__1,__1> local_4290;
  source_loc local_4278;
  allocator<char> local_4259;
  string local_4258;
  allocator<char> local_4231;
  string local_4230;
  allocator<char> local_4209;
  string local_4208;
  string local_41e8;
  allocator<char> local_41c1;
  string local_41c0;
  allocator<char> local_4199;
  string local_4198;
  stringstream local_4178 [8];
  stringstream ss_25;
  ostream local_4168 [383];
  allocator<char> local_3fe9;
  string local_3fe8;
  allocator<char> local_3fc1;
  string local_3fc0;
  allocator<char> local_3f99;
  string local_3f98;
  string local_3f78;
  allocator<char> local_3f51;
  string local_3f50;
  allocator<char> local_3f29;
  string local_3f28;
  stringstream local_3f08 [8];
  stringstream ss_24;
  ostream local_3ef8 [381];
  RefEl local_3d7b;
  RefEl local_3d7a;
  allocator<char> local_3d79;
  string local_3d78;
  allocator<char> local_3d51;
  string local_3d50;
  allocator<char> local_3d29;
  string local_3d28;
  string local_3d08;
  allocator<char> local_3ce1;
  string local_3ce0;
  allocator<char> local_3cb9;
  string local_3cb8;
  stringstream local_3c98 [8];
  stringstream ss_23;
  ostream local_3c88 [376];
  Matrix<double,__1,__1,_0,__1,__1> local_3b10;
  source_loc local_3af8;
  allocator<char> local_3ad9;
  string local_3ad8;
  allocator<char> local_3ab1;
  string local_3ab0;
  allocator<char> local_3a89;
  string local_3a88;
  string local_3a68;
  allocator<char> local_3a41;
  string local_3a40;
  allocator<char> local_3a19;
  string local_3a18;
  stringstream local_39f8 [8];
  stringstream ss_22;
  ostream local_39e8 [383];
  allocator<char> local_3869;
  string local_3868;
  allocator<char> local_3841;
  string local_3840;
  allocator<char> local_3819;
  string local_3818;
  string local_37f8;
  allocator<char> local_37d1;
  string local_37d0;
  allocator<char> local_37a9;
  string local_37a8;
  stringstream local_3788 [8];
  stringstream ss_21;
  ostream local_3778 [381];
  RefEl local_35fb;
  RefEl local_35fa;
  allocator<char> local_35f9;
  string local_35f8;
  allocator<char> local_35d1;
  string local_35d0;
  allocator<char> local_35a9;
  string local_35a8;
  string local_3588;
  allocator<char> local_3561;
  string local_3560;
  allocator<char> local_3539;
  string local_3538;
  stringstream local_3518 [8];
  stringstream ss_20;
  ostream local_3508 [376];
  double local_3390;
  Type local_3388;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_3378;
  undefined1 local_3340 [8];
  MatrixXd child_corners_1;
  string local_3320;
  allocator<char> local_32f9;
  string local_32f8;
  allocator<char> local_32d1;
  string local_32d0;
  string local_32b0;
  allocator<char> local_3289;
  string local_3288;
  allocator<char> local_3261;
  string local_3260;
  stringstream local_3240 [8];
  stringstream ss_19;
  ostream local_3230 [376];
  DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *local_30b8;
  Matrix<int,__1,__1,_0,__1,__1> *child_polygon_1;
  string local_30a8;
  allocator<char> local_3081;
  string local_3080;
  allocator<char> local_3059;
  string local_3058;
  string local_3038;
  allocator<char> local_3011;
  string local_3010;
  allocator<char> local_2fe9;
  string local_2fe8;
  stringstream local_2fc8 [8];
  stringstream ss_18;
  ostream local_2fb8 [376];
  undefined1 local_2e40 [8];
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  child_polygon_vec_1;
  undefined1 local_2e20 [8];
  Hybrid2DRefinementPattern rp_1;
  sub_idx_t anchor_1;
  RefPat parent_ref_pat_1;
  EdgeChildInfo *parent_child_info_1;
  allocator<char> local_2dc9;
  string local_2dc8;
  allocator<char> local_2da1;
  string local_2da0;
  stringstream local_2d80 [8];
  stringstream ss_17;
  ostream local_2d70 [376];
  Matrix<double,__1,__1,_0,__1,__1> local_2bf8;
  source_loc local_2be0;
  allocator<char> local_2bc1;
  string local_2bc0;
  allocator<char> local_2b99;
  string local_2b98;
  allocator<char> local_2b71;
  string local_2b70;
  string local_2b50;
  allocator<char> local_2b29;
  string local_2b28;
  allocator<char> local_2b01;
  string local_2b00;
  stringstream local_2ae0 [8];
  stringstream ss_16;
  ostream local_2ad0 [383];
  allocator<char> local_2951;
  string local_2950;
  allocator<char> local_2929;
  string local_2928;
  allocator<char> local_2901;
  string local_2900;
  string local_28e0;
  allocator<char> local_28b9;
  string local_28b8;
  allocator<char> local_2891;
  string local_2890;
  stringstream local_2870 [8];
  stringstream ss_15;
  ostream local_2860 [381];
  RefEl local_26e3;
  RefEl local_26e2;
  allocator<char> local_26e1;
  string local_26e0;
  allocator<char> local_26b9;
  string local_26b8;
  allocator<char> local_2691;
  string local_2690;
  string local_2670;
  allocator<char> local_2649;
  string local_2648;
  allocator<char> local_2621;
  string local_2620;
  stringstream local_2600 [8];
  stringstream ss_14;
  ostream local_25f0 [376];
  Matrix<double,__1,__1,_0,__1,__1> local_2478;
  source_loc local_2460;
  allocator<char> local_2441;
  string local_2440;
  allocator<char> local_2419;
  string local_2418;
  allocator<char> local_23f1;
  string local_23f0;
  string local_23d0;
  allocator<char> local_23a9;
  string local_23a8;
  allocator<char> local_2381;
  string local_2380;
  stringstream local_2360 [8];
  stringstream ss_13;
  ostream local_2350 [383];
  allocator<char> local_21d1;
  string local_21d0;
  allocator<char> local_21a9;
  string local_21a8;
  allocator<char> local_2181;
  string local_2180;
  string local_2160;
  allocator<char> local_2139;
  string local_2138;
  allocator<char> local_2111;
  string local_2110;
  stringstream local_20f0 [8];
  stringstream ss_12;
  ostream local_20e0 [381];
  RefEl local_1f63;
  RefEl local_1f62;
  allocator<char> local_1f61;
  string local_1f60;
  allocator<char> local_1f39;
  string local_1f38;
  allocator<char> local_1f11;
  string local_1f10;
  string local_1ef0;
  allocator<char> local_1ec9;
  string local_1ec8;
  allocator<char> local_1ea1;
  string local_1ea0;
  stringstream local_1e80 [8];
  stringstream ss_11;
  ostream local_1e70 [383];
  allocator<char> local_1cf1;
  string local_1cf0;
  allocator<char> local_1cc9;
  string local_1cc8;
  allocator<char> local_1ca1;
  string local_1ca0;
  string local_1c80;
  allocator<char> local_1c59;
  string local_1c58;
  allocator<char> local_1c31;
  string local_1c30;
  stringstream local_1c10 [8];
  stringstream ss_10;
  ostream local_1c00 [376];
  Matrix<double,__1,__1,_0,__1,__1> local_1a88;
  source_loc local_1a70;
  allocator<char> local_1a51;
  string local_1a50;
  allocator<char> local_1a29;
  string local_1a28;
  allocator<char> local_1a01;
  string local_1a00;
  string local_19e0;
  allocator<char> local_19b9;
  string local_19b8;
  allocator<char> local_1991;
  string local_1990;
  stringstream local_1970 [8];
  stringstream ss_9;
  ostream local_1960 [382];
  RefEl local_17e2;
  RefEl local_17e1;
  Matrix<double,__1,__1,_0,__1,__1> local_17e0;
  source_loc local_17c8;
  allocator<char> local_17a9;
  string local_17a8;
  allocator<char> local_1781;
  string local_1780;
  allocator<char> local_1759;
  string local_1758;
  string local_1738;
  allocator<char> local_1711;
  string local_1710;
  allocator<char> local_16e9;
  string local_16e8;
  stringstream local_16c8 [8];
  stringstream ss_8;
  ostream local_16b8 [381];
  RefEl local_153b;
  RefEl local_153a;
  allocator<char> local_1539;
  string local_1538;
  allocator<char> local_1511;
  string local_1510;
  allocator<char> local_14e9;
  string local_14e8;
  string local_14c8;
  allocator<char> local_14a1;
  string local_14a0;
  allocator<char> local_1479;
  string local_1478;
  stringstream local_1458 [8];
  stringstream ss_7;
  ostream local_1448 [376];
  double local_12d0;
  Type local_12c8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_12b8;
  undefined1 local_1280 [8];
  MatrixXd child_corners;
  string local_1260;
  allocator<char> local_1239;
  string local_1238;
  allocator<char> local_1211;
  string local_1210;
  string local_11f0;
  allocator<char> local_11c9;
  string local_11c8;
  allocator<char> local_11a1;
  string local_11a0;
  stringstream local_1180 [8];
  stringstream ss_6;
  ostream local_1170 [376];
  DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *local_ff8;
  Matrix<int,__1,__1,_0,__1,__1> *child_polygon;
  string local_fe8;
  allocator<char> local_fc1;
  string local_fc0;
  allocator<char> local_f99;
  string local_f98;
  string local_f78;
  allocator<char> local_f51;
  string local_f50;
  allocator<char> local_f29;
  string local_f28;
  stringstream local_f08 [8];
  stringstream ss_5;
  ostream local_ef8 [376];
  undefined1 local_d80 [8];
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  child_polygon_vec;
  undefined1 local_d60 [8];
  Hybrid2DRefinementPattern rp;
  sub_idx_t anchor;
  RefPat parent_ref_pat;
  CellChildInfo *parent_child_info;
  dim_t child_rel_codim;
  allocator<char> local_d01;
  string local_d00;
  allocator<char> local_cd9;
  string local_cd8;
  string local_cb8;
  allocator<char> local_c91;
  string local_c90;
  allocator<char> local_c69;
  string local_c68;
  stringstream local_c48 [8];
  stringstream ss_4;
  ostream local_c38 [380];
  uint local_abc;
  uint local_ab8;
  glb_idx_t parent_idx;
  dim_t parent_codim;
  RefEl parent_ref_el;
  Entity *parent;
  string local_aa0;
  allocator<char> local_a79;
  string local_a78;
  allocator<char> local_a51;
  string local_a50;
  string local_a30;
  allocator<char> local_a09;
  string local_a08;
  allocator<char> local_9e1;
  string local_9e0;
  stringstream local_9c0 [8];
  stringstream ss_3;
  ostream local_9b0 [383];
  allocator<char> local_831;
  string local_830;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  stringstream local_750 [8];
  stringstream ss_2;
  ostream local_740 [376];
  sub_idx_t local_5c8;
  allocator<char> local_5c1;
  sub_idx_t child_number;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  stringstream local_4e0 [8];
  stringstream ss_1;
  ostream local_4d0 [376];
  reference local_358;
  ParentInfo *child_pi;
  Entity *pEStack_348;
  glb_idx_t child_idx;
  Entity *child_entity;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
  *child_entities_parent_info;
  int local_308;
  dim_t codim;
  undefined1 local_300 [8];
  MatrixXd nil_coords;
  vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
  *cell_child_info;
  vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
  *ed_child_info;
  vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
  *pt_child_info;
  Mesh *child_mesh;
  Mesh *parent_mesh;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [376];
  char *local_40;
  undefined8 local_38;
  source_loc local_30;
  size_type local_14;
  MeshHierarchy *pMStack_10;
  size_type num_levels;
  MeshHierarchy *this_local;
  
  pMStack_10 = this;
  local_14 = NumLevels(this);
  p_Var6 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)Logger()
  ;
  peVar7 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var6);
  spdlog::source_loc::source_loc
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
             ,0x64a,"initGeometryInParent");
  local_40 = "Entering MeshHierarchy::initGeometryInParent: {} levels";
  local_38 = 0x37;
  fmt_06.str_.size_ = 0x37;
  fmt_06.str_.data_ = "Entering MeshHierarchy::initGeometryInParent: {} levels";
  loc.line = local_30.line;
  loc._12_4_ = local_30._12_4_;
  loc.filename = local_30.filename;
  loc.funcname = local_30.funcname;
  spdlog::logger::log<unsigned_int_const&>(peVar7,loc,debug,fmt_06,&local_14);
  if (local_14 < 2) {
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::operator<<(local_1b8,"Must have been refined at least once");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"num_levels > 1",&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_221);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1f8,&local_220,0x64e,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"false",&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_291);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"",(allocator<char> *)((long)&parent_mesh + 7));
    lf::base::AssertionFailed(&local_268,&local_290,0x64e,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&parent_mesh + 7));
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    abort();
  }
  p_Var8 = (__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::
           vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
           ::at(&this->meshes_,(ulong)(local_14 - 2));
  peVar9 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(p_Var8);
  p_Var8 = (__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::
           vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
           ::at(&this->meshes_,(ulong)(local_14 - 1));
  peVar10 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*(p_Var8);
  std::
  vector<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>,_std::allocator<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>_>_>
  ::at(&this->point_child_infos_,(ulong)(local_14 - 2));
  this_00 = std::
            vector<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>,_std::allocator<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>_>_>
            ::at(&this->edge_child_infos_,(ulong)(local_14 - 2));
  nil_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)std::
              vector<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>,_std::allocator<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>_>_>
              ::at(&this->cell_child_infos_,(ulong)(local_14 - 2));
  codim = 0;
  local_308 = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_300,(int *)&codim,&local_308);
  child_entities_parent_info._4_4_ = 0;
  do {
    if (2 < child_entities_parent_info._4_4_) {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_300);
      return;
    }
    this_01 = std::
              vector<std::array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>,_std::allocator<std::array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>_>_>
              ::back(&this->parent_infos_);
    this_02 = std::
              array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>
              ::operator[](this_01,(ulong)child_entities_parent_info._4_4_);
    iVar4 = (*peVar10->_vptr_Mesh[2])(peVar10,(ulong)child_entities_parent_info._4_4_);
    __begin3._M_current = (Entity **)CONCAT44(extraout_var,iVar4);
    __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    child_entity = (Entity *)
                   std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              &__begin3);
    while (bVar1 = __gnu_cxx::
                   operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                             (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                       *)&child_entity), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppEVar11 = __gnu_cxx::
                 __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                 ::operator*(&__end3);
      pEStack_348 = *ppEVar11;
      child_pi._4_4_ = (*peVar10->_vptr_Mesh[5])(peVar10,pEStack_348);
      local_358 = std::
                  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::
                  operator[](this_02,(ulong)child_pi._4_4_);
      bVar1 = std::operator==(&local_358->rel_ref_geo_,(nullptr_t)0x0);
      if (!bVar1) {
        std::__cxx11::stringstream::stringstream(local_4e0);
        std::operator<<(local_4d0,"No double initialization of rel_ref_geo_");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_500,"child_pi.rel_ref_geo_ == nullptr",&local_501);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_528,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                   ,&local_529);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_500,&local_528,0x66a,&local_550);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_528);
        std::allocator<char>::~allocator(&local_529);
        std::__cxx11::string::~string((string *)&local_500);
        std::allocator<char>::~allocator(&local_501);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"false",&local_571);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_598,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                   ,&local_599);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&child_number,"",&local_5c1);
        lf::base::AssertionFailed(&local_570,&local_598,0x66a,(string *)&child_number);
        std::__cxx11::string::~string((string *)&child_number);
        std::allocator<char>::~allocator(&local_5c1);
        std::__cxx11::string::~string((string *)&local_598);
        std::allocator<char>::~allocator(&local_599);
        std::__cxx11::string::~string((string *)&local_570);
        std::allocator<char>::~allocator(&local_571);
        abort();
      }
      local_5c8 = local_358->child_number;
      if (local_5c8 == 0xffffffff) {
        std::__cxx11::stringstream::stringstream(local_750);
        std::operator<<(local_740,"Child number missing");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_770,"child_number != idx_nil",&local_771);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_798,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                   ,&local_799);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_770,&local_798,0x66d,&local_7c0);
        std::__cxx11::string::~string((string *)&local_7c0);
        std::__cxx11::string::~string((string *)&local_798);
        std::allocator<char>::~allocator(&local_799);
        std::__cxx11::string::~string((string *)&local_770);
        std::allocator<char>::~allocator(&local_771);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"false",&local_7e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_808,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                   ,&local_809);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"",&local_831);
        lf::base::AssertionFailed(&local_7e0,&local_808,0x66d,&local_830);
        std::__cxx11::string::~string((string *)&local_830);
        std::allocator<char>::~allocator(&local_831);
        std::__cxx11::string::~string((string *)&local_808);
        std::allocator<char>::~allocator(&local_809);
        std::__cxx11::string::~string((string *)&local_7e0);
        std::allocator<char>::~allocator(&local_7e1);
        abort();
      }
      if (local_358->parent_ptr == (Entity *)0x0) {
        std::__cxx11::stringstream::stringstream(local_9c0);
        std::operator<<(local_9b0,"No valid parent pointer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9e0,"child_pi.parent_ptr != nullptr",&local_9e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a08,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                   ,&local_a09);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_9e0,&local_a08,0x66f,&local_a30);
        std::__cxx11::string::~string((string *)&local_a30);
        std::__cxx11::string::~string((string *)&local_a08);
        std::allocator<char>::~allocator(&local_a09);
        std::__cxx11::string::~string((string *)&local_9e0);
        std::allocator<char>::~allocator(&local_9e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a50,"false",&local_a51);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a78,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                   ,&local_a79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_aa0,"",(allocator<char> *)((long)&parent + 7));
        lf::base::AssertionFailed(&local_a50,&local_a78,0x66f,&local_aa0);
        std::__cxx11::string::~string((string *)&local_aa0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&parent + 7));
        std::__cxx11::string::~string((string *)&local_a78);
        std::allocator<char>::~allocator(&local_a79);
        std::__cxx11::string::~string((string *)&local_a50);
        std::allocator<char>::~allocator(&local_a51);
        abort();
      }
      _parent_codim = local_358->parent_ptr;
      iVar4 = (*_parent_codim->_vptr_Entity[4])();
      parent_idx._3_1_ = (RefElType)iVar4;
      local_ab8 = (**_parent_codim->_vptr_Entity)();
      local_abc = (*peVar9->_vptr_Mesh[5])(peVar9,_parent_codim);
      if (child_entities_parent_info._4_4_ < local_ab8) {
        std::__cxx11::stringstream::stringstream(local_c48);
        std::operator<<(local_c38,"Paren codim > child codim!");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c68,"parent_codim <= codim",&local_c69);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c90,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                   ,&local_c91);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_c68,&local_c90,0x678,&local_cb8);
        std::__cxx11::string::~string((string *)&local_cb8);
        std::__cxx11::string::~string((string *)&local_c90);
        std::allocator<char>::~allocator(&local_c91);
        std::__cxx11::string::~string((string *)&local_c68);
        std::allocator<char>::~allocator(&local_c69);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_cd8,"false",&local_cd9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d00,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                   ,&local_d01);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&child_rel_codim,"",(allocator<char> *)((long)&parent_child_info + 7));
        lf::base::AssertionFailed(&local_cd8,&local_d00,0x678,(string *)&child_rel_codim);
        std::__cxx11::string::~string((string *)&child_rel_codim);
        std::allocator<char>::~allocator((allocator<char> *)((long)&parent_child_info + 7));
        std::__cxx11::string::~string((string *)&local_d00);
        std::allocator<char>::~allocator(&local_d01);
        std::__cxx11::string::~string((string *)&local_cd8);
        std::allocator<char>::~allocator(&local_cd9);
        abort();
      }
      parent_child_info._0_4_ = child_entities_parent_info._4_4_ - local_ab8;
      if (local_ab8 == 0) {
        pvVar12 = std::
                  vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                  ::operator[]((vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                                *)nil_coords.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols,(ulong)local_abc);
        rp._28_4_ = pvVar12->ref_pat_;
        rp._24_4_ = pvVar12->anchor_;
        child_polygon_vec.
        super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = parent_idx._3_1_;
        Hybrid2DRefinementPattern::Hybrid2DRefinementPattern
                  ((Hybrid2DRefinementPattern *)local_d60,parent_idx._3_1_,rp._28_4_,rp._24_4_);
        Hybrid2DRefinementPattern::ChildPolygons
                  ((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                    *)local_d80,(Hybrid2DRefinementPattern *)local_d60,(dim_t)parent_child_info);
        uVar13 = (ulong)local_5c8;
        sVar15 = std::
                 vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                 ::size((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                         *)local_d80);
        if (sVar15 <= uVar13) {
          std::__cxx11::stringstream::stringstream(local_f08);
          poVar18 = std::operator<<(local_ef8,"Child number = ");
          poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_5c8);
          poVar18 = std::operator<<(poVar18," >= ");
          sVar15 = std::
                   vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                   ::size((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                           *)local_d80);
          std::ostream::operator<<(poVar18,sVar15);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f28,"child_number < child_polygon_vec.size()",&local_f29);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f50,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,&local_f51);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_f28,&local_f50,0x689,&local_f78);
          std::__cxx11::string::~string((string *)&local_f78);
          std::__cxx11::string::~string((string *)&local_f50);
          std::allocator<char>::~allocator(&local_f51);
          std::__cxx11::string::~string((string *)&local_f28);
          std::allocator<char>::~allocator(&local_f29);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f98,"false",&local_f99);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_fc0,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,&local_fc1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_fe8,"",(allocator<char> *)((long)&child_polygon + 7));
          lf::base::AssertionFailed(&local_f98,&local_fc0,0x689,&local_fe8);
          std::__cxx11::string::~string((string *)&local_fe8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&child_polygon + 7));
          std::__cxx11::string::~string((string *)&local_fc0);
          std::allocator<char>::~allocator(&local_fc1);
          std::__cxx11::string::~string((string *)&local_f98);
          std::allocator<char>::~allocator(&local_f99);
          abort();
        }
        local_ff8 = (DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)
                    std::
                    vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                    ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                  *)local_d80,(ulong)local_5c8);
        IVar16 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows
                           ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)local_ff8);
        if (IVar16 != 2) {
          std::__cxx11::stringstream::stringstream(local_1180);
          std::operator<<(local_1170,"Need two coordinates in parent cell");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_11a0,"child_polygon.rows() == 2",&local_11a1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_11c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,&local_11c9);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_11a0,&local_11c8,0x68d,&local_11f0);
          std::__cxx11::string::~string((string *)&local_11f0);
          std::__cxx11::string::~string((string *)&local_11c8);
          std::allocator<char>::~allocator(&local_11c9);
          std::__cxx11::string::~string((string *)&local_11a0);
          std::allocator<char>::~allocator(&local_11a1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1210,"false",&local_1211);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1238,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,&local_1239);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1260,"",
                     (allocator<char> *)
                     ((long)&child_corners.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols + 7));
          lf::base::AssertionFailed(&local_1210,&local_1238,0x68d,&local_1260);
          std::__cxx11::string::~string((string *)&local_1260);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&child_corners.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols + 7));
          std::__cxx11::string::~string((string *)&local_1238);
          std::allocator<char>::~allocator(&local_1239);
          std::__cxx11::string::~string((string *)&local_1210);
          std::allocator<char>::~allocator(&local_1211);
          abort();
        }
        Eigen::DenseBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cast<double>
                  (&local_12c8,local_ff8);
        sVar5 = lf::geometry::RefinementPattern::LatticeConst((RefinementPattern *)local_d60);
        local_12d0 = (double)sVar5;
        Eigen::
        MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,-1,-1,0,-1,-1>const>>
        ::operator/(&local_12b8,
                    (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>>
                     *)&local_12c8,&local_12d0);
        Eigen::Matrix<double,-1,-1,0,-1,-1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_1280,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)&local_12b8);
        if (child_entities_parent_info._4_4_ == 0) {
          pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              (&pvVar12->child_cell_idx,(ulong)local_5c8);
          if (*pvVar17 != child_pi._4_4_) {
            std::__cxx11::stringstream::stringstream(local_1458);
            poVar18 = std::operator<<(local_1448,"parent_child_info.child_cell_idx.at(");
            poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_5c8);
            std::operator<<(poVar18," ) !== child_idx");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1478,
                       "parent_child_info.child_cell_idx.at(child_number) == child_idx",&local_1479)
            ;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_14a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_14a1);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_1478,&local_14a0,0x698,&local_14c8);
            std::__cxx11::string::~string((string *)&local_14c8);
            std::__cxx11::string::~string((string *)&local_14a0);
            std::allocator<char>::~allocator(&local_14a1);
            std::__cxx11::string::~string((string *)&local_1478);
            std::allocator<char>::~allocator(&local_1479);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_14e8,"false",&local_14e9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1510,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_1511);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_1538,"",&local_1539)
            ;
            lf::base::AssertionFailed(&local_14e8,&local_1510,0x698,&local_1538);
            std::__cxx11::string::~string((string *)&local_1538);
            std::allocator<char>::~allocator(&local_1539);
            std::__cxx11::string::~string((string *)&local_1510);
            std::allocator<char>::~allocator(&local_1511);
            std::__cxx11::string::~string((string *)&local_14e8);
            std::allocator<char>::~allocator(&local_14e9);
            abort();
          }
          IVar16 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                             ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                              local_1280);
          if (IVar16 == 3) {
            iVar4 = (*pEStack_348->_vptr_Entity[4])();
            local_153a.type_ = (RefElType)iVar4;
            RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_153a);
            local_153b = lf::base::RefEl::kTria();
            RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_153b);
            if (RVar2 != RVar3) {
              std::__cxx11::stringstream::stringstream(local_16c8);
              std::operator<<(local_16b8,"Must be triangle!");
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_16e8,"child_entity->RefEl() == lf::base::RefEl::kTria()",
                         &local_16e9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1710,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,&local_1711);
              std::__cxx11::stringstream::str();
              lf::base::AssertionFailed(&local_16e8,&local_1710,0x69d,&local_1738);
              std::__cxx11::string::~string((string *)&local_1738);
              std::__cxx11::string::~string((string *)&local_1710);
              std::allocator<char>::~allocator(&local_1711);
              std::__cxx11::string::~string((string *)&local_16e8);
              std::allocator<char>::~allocator(&local_16e9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1758,"false",&local_1759);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1780,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,&local_1781);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_17a8,"",&local_17a9);
              lf::base::AssertionFailed(&local_1758,&local_1780,0x69d,&local_17a8);
              std::__cxx11::string::~string((string *)&local_17a8);
              std::allocator<char>::~allocator(&local_17a9);
              std::__cxx11::string::~string((string *)&local_1780);
              std::allocator<char>::~allocator(&local_1781);
              std::__cxx11::string::~string((string *)&local_1758);
              std::allocator<char>::~allocator(&local_1759);
              abort();
            }
            p_Var6 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)Logger();
            peVar7 = std::
                     __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(p_Var6);
            spdlog::source_loc::source_loc
                      (&local_17c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,0x69f,"initGeometryInParent");
            local_17e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = 0xa10651;
            local_17e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols = 0x18;
            fmt_05.str_.size_ = 0x18;
            fmt_05.str_.data_ = "Triangle in {}: geo = {}";
            loc_00.line = local_17c8.line;
            loc_00._12_4_ = local_17c8._12_4_;
            loc_00.filename = local_17c8.filename;
            loc_00.funcname = local_17c8.funcname;
            spdlog::logger::log<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                      (peVar7,loc_00,trace,fmt_05,(RefEl *)((long)&parent_idx + 3),
                       (Matrix<double,__1,__1,_0,__1,__1> *)local_1280);
            std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                      (&local_17e0);
            std::
            unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
            ::operator=((unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
                         *)&local_358->rel_ref_geo_,
                        (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>
                         *)&local_17e0);
            std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::
            ~unique_ptr((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>
                         *)&local_17e0);
          }
          else {
            if (IVar16 != 4) {
              std::__cxx11::stringstream::stringstream(local_1c10);
              poVar18 = std::operator<<(local_1c00,"Illegal number ");
              IVar16 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                                 ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                  local_1280);
              poVar18 = (ostream *)std::ostream::operator<<(poVar18,IVar16);
              std::operator<<(poVar18," of corners for a child cell");
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1c30,"false",&local_1c31);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1c58,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,&local_1c59);
              std::__cxx11::stringstream::str();
              lf::base::AssertionFailed(&local_1c30,&local_1c58,0x6b3,&local_1c80);
              std::__cxx11::string::~string((string *)&local_1c80);
              std::__cxx11::string::~string((string *)&local_1c58);
              std::allocator<char>::~allocator(&local_1c59);
              std::__cxx11::string::~string((string *)&local_1c30);
              std::allocator<char>::~allocator(&local_1c31);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1ca0,"false",&local_1ca1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1cc8,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,&local_1cc9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1cf0,"",&local_1cf1);
              lf::base::AssertionFailed(&local_1ca0,&local_1cc8,0x6b3,&local_1cf0);
              std::__cxx11::string::~string((string *)&local_1cf0);
              std::allocator<char>::~allocator(&local_1cf1);
              std::__cxx11::string::~string((string *)&local_1cc8);
              std::allocator<char>::~allocator(&local_1cc9);
              std::__cxx11::string::~string((string *)&local_1ca0);
              std::allocator<char>::~allocator(&local_1ca1);
              abort();
            }
            iVar4 = (*pEStack_348->_vptr_Entity[4])();
            local_17e1.type_ = (RefElType)iVar4;
            RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_17e1);
            local_17e2 = lf::base::RefEl::kQuad();
            RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_17e2);
            if (RVar2 != RVar3) {
              std::__cxx11::stringstream::stringstream(local_1970);
              std::operator<<(local_1960,"Must be quad!");
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1990,"child_entity->RefEl() == lf::base::RefEl::kQuad()",
                         &local_1991);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_19b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,&local_19b9);
              std::__cxx11::stringstream::str();
              lf::base::AssertionFailed(&local_1990,&local_19b8,0x6a8,&local_19e0);
              std::__cxx11::string::~string((string *)&local_19e0);
              std::__cxx11::string::~string((string *)&local_19b8);
              std::allocator<char>::~allocator(&local_19b9);
              std::__cxx11::string::~string((string *)&local_1990);
              std::allocator<char>::~allocator(&local_1991);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a00,"false",&local_1a01);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a28,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                         ,&local_1a29);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a50,"",&local_1a51);
              lf::base::AssertionFailed(&local_1a00,&local_1a28,0x6a8,&local_1a50);
              std::__cxx11::string::~string((string *)&local_1a50);
              std::allocator<char>::~allocator(&local_1a51);
              std::__cxx11::string::~string((string *)&local_1a28);
              std::allocator<char>::~allocator(&local_1a29);
              std::__cxx11::string::~string((string *)&local_1a00);
              std::allocator<char>::~allocator(&local_1a01);
              abort();
            }
            p_Var6 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)Logger();
            peVar7 = std::
                     __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(p_Var6);
            spdlog::source_loc::source_loc
                      (&local_1a70,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,0x6aa,"initGeometryInParent");
            local_1a88.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = 0xa106aa;
            local_1a88.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols = 0x14;
            fmt_04.str_.size_ = 0x14;
            fmt_04.str_.data_ = "Quad in {}: geo = {}";
            loc_01.line = local_1a70.line;
            loc_01._12_4_ = local_1a70._12_4_;
            loc_01.filename = local_1a70.filename;
            loc_01.funcname = local_1a70.funcname;
            spdlog::logger::log<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                      (peVar7,loc_01,trace,fmt_04,(RefEl *)((long)&parent_idx + 3),
                       (Matrix<double,__1,__1,_0,__1,__1> *)local_1280);
            std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                      (&local_1a88);
            std::
            unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
            ::operator=((unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
                         *)&local_358->rel_ref_geo_,
                        (unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>
                         *)&local_1a88);
            std::unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>::
            ~unique_ptr((unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>
                         *)&local_1a88);
          }
        }
        else if (child_entities_parent_info._4_4_ == 1) {
          pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              (&pvVar12->child_edge_idx,(ulong)local_5c8);
          if (*pvVar17 != child_pi._4_4_) {
            std::__cxx11::stringstream::stringstream(local_1e80);
            poVar18 = std::operator<<(local_1e70,"parent_child_info.child_edge_idx.at(");
            poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_5c8);
            std::operator<<(poVar18," ) !== child_idx");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1ea0,
                       "parent_child_info.child_edge_idx.at(child_number) == child_idx",&local_1ea1)
            ;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1ec8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_1ec9);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_1ea0,&local_1ec8,0x6bd,&local_1ef0);
            std::__cxx11::string::~string((string *)&local_1ef0);
            std::__cxx11::string::~string((string *)&local_1ec8);
            std::allocator<char>::~allocator(&local_1ec9);
            std::__cxx11::string::~string((string *)&local_1ea0);
            std::allocator<char>::~allocator(&local_1ea1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f10,"false",&local_1f11);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f38,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_1f39);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f60,"",&local_1f61)
            ;
            lf::base::AssertionFailed(&local_1f10,&local_1f38,0x6bd,&local_1f60);
            std::__cxx11::string::~string((string *)&local_1f60);
            std::allocator<char>::~allocator(&local_1f61);
            std::__cxx11::string::~string((string *)&local_1f38);
            std::allocator<char>::~allocator(&local_1f39);
            std::__cxx11::string::~string((string *)&local_1f10);
            std::allocator<char>::~allocator(&local_1f11);
            abort();
          }
          iVar4 = (*pEStack_348->_vptr_Entity[4])();
          local_1f62.type_ = (RefElType)iVar4;
          RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_1f62);
          local_1f63 = lf::base::RefEl::kSegment();
          RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_1f63);
          if (RVar2 != RVar3) {
            std::__cxx11::stringstream::stringstream(local_20f0);
            std::operator<<(local_20e0,"Must be an edge!");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2110,"child_entity->RefEl() == lf::base::RefEl::kSegment()",
                       &local_2111);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2138,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_2139);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_2110,&local_2138,0x6c0,&local_2160);
            std::__cxx11::string::~string((string *)&local_2160);
            std::__cxx11::string::~string((string *)&local_2138);
            std::allocator<char>::~allocator(&local_2139);
            std::__cxx11::string::~string((string *)&local_2110);
            std::allocator<char>::~allocator(&local_2111);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2180,"false",&local_2181);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_21a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_21a9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_21d0,"",&local_21d1)
            ;
            lf::base::AssertionFailed(&local_2180,&local_21a8,0x6c0,&local_21d0);
            std::__cxx11::string::~string((string *)&local_21d0);
            std::allocator<char>::~allocator(&local_21d1);
            std::__cxx11::string::~string((string *)&local_21a8);
            std::allocator<char>::~allocator(&local_21a9);
            std::__cxx11::string::~string((string *)&local_2180);
            std::allocator<char>::~allocator(&local_2181);
            abort();
          }
          IVar16 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                             ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                              local_1280);
          if (IVar16 != 2) {
            std::__cxx11::stringstream::stringstream(local_2360);
            std::operator<<(local_2350,"Segement must have two endpoints");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2380,"child_corners.cols() == 2",&local_2381);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_23a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_23a9);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_2380,&local_23a8,0x6c2,&local_23d0);
            std::__cxx11::string::~string((string *)&local_23d0);
            std::__cxx11::string::~string((string *)&local_23a8);
            std::allocator<char>::~allocator(&local_23a9);
            std::__cxx11::string::~string((string *)&local_2380);
            std::allocator<char>::~allocator(&local_2381);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_23f0,"false",&local_23f1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2418,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_2419);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_2440,"",&local_2441)
            ;
            lf::base::AssertionFailed(&local_23f0,&local_2418,0x6c2,&local_2440);
            std::__cxx11::string::~string((string *)&local_2440);
            std::allocator<char>::~allocator(&local_2441);
            std::__cxx11::string::~string((string *)&local_2418);
            std::allocator<char>::~allocator(&local_2419);
            std::__cxx11::string::~string((string *)&local_23f0);
            std::allocator<char>::~allocator(&local_23f1);
            abort();
          }
          p_Var6 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar7 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var6);
          spdlog::source_loc::source_loc
                    (&local_2460,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,0x6c4,"initGeometryInParent");
          local_2478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = 0xa107c1;
          local_2478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = 0x17;
          fmt_03.str_.size_ = 0x17;
          fmt_03.str_.data_ = "Segment in {}: geo = {}";
          loc_02.line = local_2460.line;
          loc_02._12_4_ = local_2460._12_4_;
          loc_02.filename = local_2460.filename;
          loc_02.funcname = local_2460.funcname;
          spdlog::logger::log<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                    (peVar7,loc_02,trace,fmt_03,(RefEl *)((long)&parent_idx + 3),
                     (Matrix<double,__1,__1,_0,__1,__1> *)local_1280);
          std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                    (&local_2478);
          std::
          unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
          ::operator=((unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
                       *)&local_358->rel_ref_geo_,
                      (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                       *)&local_2478);
          std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                       *)&local_2478);
        }
        else {
          if (child_entities_parent_info._4_4_ != 2) {
            std::__cxx11::stringstream::stringstream(local_2d80);
            poVar18 = std::operator<<(local_2d70,"unexpected codim ");
            std::ostream::operator<<(poVar18,child_entities_parent_info._4_4_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2da0,"false",&local_2da1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2dc8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_2dc9);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_2da0,&local_2dc8,0x6db,(string *)&parent_child_info_1);
            std::__cxx11::string::~string((string *)&parent_child_info_1);
            std::__cxx11::string::~string((string *)&local_2dc8);
            std::allocator<char>::~allocator(&local_2dc9);
            std::__cxx11::string::~string((string *)&local_2da0);
            std::allocator<char>::~allocator(&local_2da1);
            prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar19,"this code should not be reached");
            __cxa_throw(prVar19,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              (&pvVar12->child_point_idx,(ulong)local_5c8);
          if (*pvVar17 != child_pi._4_4_) {
            std::__cxx11::stringstream::stringstream(local_2600);
            poVar18 = std::operator<<(local_25f0,"parent_child_info.child_point_idx.at(");
            poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_5c8);
            std::operator<<(poVar18," ) !== child_idx");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2620,
                       "parent_child_info.child_point_idx.at( child_number) == child_idx",
                       &local_2621);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2648,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_2649);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_2620,&local_2648,0x6ce,&local_2670);
            std::__cxx11::string::~string((string *)&local_2670);
            std::__cxx11::string::~string((string *)&local_2648);
            std::allocator<char>::~allocator(&local_2649);
            std::__cxx11::string::~string((string *)&local_2620);
            std::allocator<char>::~allocator(&local_2621);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2690,"false",&local_2691);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_26b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_26b9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_26e0,"",&local_26e1)
            ;
            lf::base::AssertionFailed(&local_2690,&local_26b8,0x6ce,&local_26e0);
            std::__cxx11::string::~string((string *)&local_26e0);
            std::allocator<char>::~allocator(&local_26e1);
            std::__cxx11::string::~string((string *)&local_26b8);
            std::allocator<char>::~allocator(&local_26b9);
            std::__cxx11::string::~string((string *)&local_2690);
            std::allocator<char>::~allocator(&local_2691);
            abort();
          }
          iVar4 = (*pEStack_348->_vptr_Entity[4])();
          local_26e2.type_ = (RefElType)iVar4;
          RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_26e2);
          local_26e3 = lf::base::RefEl::kPoint();
          RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_26e3);
          if (RVar2 != RVar3) {
            std::__cxx11::stringstream::stringstream(local_2870);
            std::operator<<(local_2860,"Must be a point!");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2890,"child_entity->RefEl() == lf::base::RefEl::kPoint()",
                       &local_2891);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_28b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_28b9);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_2890,&local_28b8,0x6d0,&local_28e0);
            std::__cxx11::string::~string((string *)&local_28e0);
            std::__cxx11::string::~string((string *)&local_28b8);
            std::allocator<char>::~allocator(&local_28b9);
            std::__cxx11::string::~string((string *)&local_2890);
            std::allocator<char>::~allocator(&local_2891);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2900,"false",&local_2901);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2928,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_2929);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_2950,"",&local_2951)
            ;
            lf::base::AssertionFailed(&local_2900,&local_2928,0x6d0,&local_2950);
            std::__cxx11::string::~string((string *)&local_2950);
            std::allocator<char>::~allocator(&local_2951);
            std::__cxx11::string::~string((string *)&local_2928);
            std::allocator<char>::~allocator(&local_2929);
            std::__cxx11::string::~string((string *)&local_2900);
            std::allocator<char>::~allocator(&local_2901);
            abort();
          }
          IVar16 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                             ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                              local_1280);
          if (IVar16 != 1) {
            std::__cxx11::stringstream::stringstream(local_2ae0);
            std::operator<<(local_2ad0,"Only a single coordindate for a point!");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b00,"child_corners.cols() == 1",&local_2b01);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b28,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_2b29);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_2b00,&local_2b28,0x6d2,&local_2b50);
            std::__cxx11::string::~string((string *)&local_2b50);
            std::__cxx11::string::~string((string *)&local_2b28);
            std::allocator<char>::~allocator(&local_2b29);
            std::__cxx11::string::~string((string *)&local_2b00);
            std::allocator<char>::~allocator(&local_2b01);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b70,"false",&local_2b71);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b98,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_2b99);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_2bc0,"",&local_2bc1)
            ;
            lf::base::AssertionFailed(&local_2b70,&local_2b98,0x6d2,&local_2bc0);
            std::__cxx11::string::~string((string *)&local_2bc0);
            std::allocator<char>::~allocator(&local_2bc1);
            std::__cxx11::string::~string((string *)&local_2b98);
            std::allocator<char>::~allocator(&local_2b99);
            std::__cxx11::string::~string((string *)&local_2b70);
            std::allocator<char>::~allocator(&local_2b71);
            abort();
          }
          p_Var6 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar7 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var6);
          spdlog::source_loc::source_loc
                    (&local_2be0,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,0x6d4,"initGeometryInParent");
          local_2bf8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = 0xa108c5;
          local_2bf8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = 0x15;
          fmt_02.str_.size_ = 0x15;
          fmt_02.str_.data_ = "Point in {}: geo = {}";
          loc_03.line = local_2be0.line;
          loc_03._12_4_ = local_2be0._12_4_;
          loc_03.filename = local_2be0.filename;
          loc_03.funcname = local_2be0.funcname;
          spdlog::logger::log<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                    (peVar7,loc_03,trace,fmt_02,(RefEl *)((long)&parent_idx + 3),
                     (Matrix<double,__1,__1,_0,__1,__1> *)local_1280);
          std::make_unique<lf::geometry::Point,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                    (&local_2bf8);
          std::
          unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
          ::operator=((unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
                       *)&local_358->rel_ref_geo_,
                      (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                      &local_2bf8);
          std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::
          ~unique_ptr((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                      &local_2bf8);
        }
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_1280);
        std::
        vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
        ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                   *)local_d80);
      }
      else if (local_ab8 == 1) {
        pvVar14 = std::
                  vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                  ::operator[](this_00,(ulong)local_abc);
        rp_1._28_4_ = pvVar14->ref_pat_;
        rp_1.anchor_set_ = true;
        rp_1._25_3_ = 0xffffff;
        child_polygon_vec_1.
        super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = parent_idx._3_1_;
        Hybrid2DRefinementPattern::Hybrid2DRefinementPattern
                  ((Hybrid2DRefinementPattern *)local_2e20,parent_idx._3_1_,rp_1._28_4_,0xffffffff);
        Hybrid2DRefinementPattern::ChildPolygons
                  ((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                    *)local_2e40,(Hybrid2DRefinementPattern *)local_2e20,(dim_t)parent_child_info);
        uVar13 = (ulong)local_5c8;
        sVar15 = std::
                 vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                 ::size((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                         *)local_2e40);
        if (sVar15 <= uVar13) {
          std::__cxx11::stringstream::stringstream(local_2fc8);
          poVar18 = std::operator<<(local_2fb8,"Child number = ");
          poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_5c8);
          poVar18 = std::operator<<(poVar18," >= ");
          sVar15 = std::
                   vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                   ::size((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                           *)local_2e40);
          std::ostream::operator<<(poVar18,sVar15);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2fe8,"child_number < child_polygon_vec.size()",&local_2fe9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3010,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,&local_3011);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_2fe8,&local_3010,0x6eb,&local_3038);
          std::__cxx11::string::~string((string *)&local_3038);
          std::__cxx11::string::~string((string *)&local_3010);
          std::allocator<char>::~allocator(&local_3011);
          std::__cxx11::string::~string((string *)&local_2fe8);
          std::allocator<char>::~allocator(&local_2fe9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3058,"false",&local_3059);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3080,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,&local_3081);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_30a8,"",(allocator<char> *)((long)&child_polygon_1 + 7));
          lf::base::AssertionFailed(&local_3058,&local_3080,0x6eb,&local_30a8);
          std::__cxx11::string::~string((string *)&local_30a8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&child_polygon_1 + 7));
          std::__cxx11::string::~string((string *)&local_3080);
          std::allocator<char>::~allocator(&local_3081);
          std::__cxx11::string::~string((string *)&local_3058);
          std::allocator<char>::~allocator(&local_3059);
          abort();
        }
        local_30b8 = (DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)
                     std::
                     vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                     ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                   *)local_2e40,(ulong)local_5c8);
        IVar16 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows
                           ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)local_30b8);
        if (IVar16 != 1) {
          std::__cxx11::stringstream::stringstream(local_3240);
          std::operator<<(local_3230,"Need one coordinate only in parent segment");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3260,"child_polygon.rows() == 1",&local_3261);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3288,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,&local_3289);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_3260,&local_3288,0x6ef,&local_32b0);
          std::__cxx11::string::~string((string *)&local_32b0);
          std::__cxx11::string::~string((string *)&local_3288);
          std::allocator<char>::~allocator(&local_3289);
          std::__cxx11::string::~string((string *)&local_3260);
          std::allocator<char>::~allocator(&local_3261);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_32d0,"false",&local_32d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_32f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,&local_32f9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3320,"",
                     (allocator<char> *)
                     ((long)&child_corners_1.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols + 7));
          lf::base::AssertionFailed(&local_32d0,&local_32f8,0x6ef,&local_3320);
          std::__cxx11::string::~string((string *)&local_3320);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&child_corners_1.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols + 7));
          std::__cxx11::string::~string((string *)&local_32f8);
          std::allocator<char>::~allocator(&local_32f9);
          std::__cxx11::string::~string((string *)&local_32d0);
          std::allocator<char>::~allocator(&local_32d1);
          abort();
        }
        Eigen::DenseBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cast<double>
                  (&local_3388,local_30b8);
        sVar5 = lf::geometry::RefinementPattern::LatticeConst((RefinementPattern *)local_2e20);
        local_3390 = (double)sVar5;
        Eigen::
        MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,-1,-1,0,-1,-1>const>>
        ::operator/(&local_3378,
                    (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>>
                     *)&local_3388,&local_3390);
        Eigen::Matrix<double,-1,-1,0,-1,-1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_3340,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)&local_3378);
        if (child_entities_parent_info._4_4_ == 1) {
          pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              (&pvVar14->child_edge_idx,(ulong)local_5c8);
          if (*pvVar17 != child_pi._4_4_) {
            std::__cxx11::stringstream::stringstream(local_3518);
            poVar18 = std::operator<<(local_3508,"edge_child_info.child_edge_idx.at(");
            poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_5c8);
            std::operator<<(poVar18," ) !== child_idx");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3538,
                       "parent_child_info.child_edge_idx.at(child_number) == child_idx",&local_3539)
            ;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3560,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_3561);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_3538,&local_3560,0x6fa,&local_3588);
            std::__cxx11::string::~string((string *)&local_3588);
            std::__cxx11::string::~string((string *)&local_3560);
            std::allocator<char>::~allocator(&local_3561);
            std::__cxx11::string::~string((string *)&local_3538);
            std::allocator<char>::~allocator(&local_3539);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_35a8,"false",&local_35a9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_35d0,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_35d1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_35f8,"",&local_35f9)
            ;
            lf::base::AssertionFailed(&local_35a8,&local_35d0,0x6fa,&local_35f8);
            std::__cxx11::string::~string((string *)&local_35f8);
            std::allocator<char>::~allocator(&local_35f9);
            std::__cxx11::string::~string((string *)&local_35d0);
            std::allocator<char>::~allocator(&local_35d1);
            std::__cxx11::string::~string((string *)&local_35a8);
            std::allocator<char>::~allocator(&local_35a9);
            abort();
          }
          iVar4 = (*pEStack_348->_vptr_Entity[4])();
          local_35fa.type_ = (RefElType)iVar4;
          RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_35fa);
          local_35fb = lf::base::RefEl::kSegment();
          RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_35fb);
          if (RVar2 != RVar3) {
            std::__cxx11::stringstream::stringstream(local_3788);
            std::operator<<(local_3778,"Must be an edge!");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_37a8,"child_entity->RefEl() == lf::base::RefEl::kSegment()",
                       &local_37a9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_37d0,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_37d1);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_37a8,&local_37d0,0x6fd,&local_37f8);
            std::__cxx11::string::~string((string *)&local_37f8);
            std::__cxx11::string::~string((string *)&local_37d0);
            std::allocator<char>::~allocator(&local_37d1);
            std::__cxx11::string::~string((string *)&local_37a8);
            std::allocator<char>::~allocator(&local_37a9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3818,"false",&local_3819);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3840,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_3841);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_3868,"",&local_3869)
            ;
            lf::base::AssertionFailed(&local_3818,&local_3840,0x6fd,&local_3868);
            std::__cxx11::string::~string((string *)&local_3868);
            std::allocator<char>::~allocator(&local_3869);
            std::__cxx11::string::~string((string *)&local_3840);
            std::allocator<char>::~allocator(&local_3841);
            std::__cxx11::string::~string((string *)&local_3818);
            std::allocator<char>::~allocator(&local_3819);
            abort();
          }
          IVar16 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                             ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                              local_3340);
          if (IVar16 != 2) {
            std::__cxx11::stringstream::stringstream(local_39f8);
            std::operator<<(local_39e8,"Segement must have two endpoints");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3a18,"child_corners.cols() == 2",&local_3a19);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3a40,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_3a41);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_3a18,&local_3a40,0x6ff,&local_3a68);
            std::__cxx11::string::~string((string *)&local_3a68);
            std::__cxx11::string::~string((string *)&local_3a40);
            std::allocator<char>::~allocator(&local_3a41);
            std::__cxx11::string::~string((string *)&local_3a18);
            std::allocator<char>::~allocator(&local_3a19);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3a88,"false",&local_3a89);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3ab0,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_3ab1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_3ad8,"",&local_3ad9)
            ;
            lf::base::AssertionFailed(&local_3a88,&local_3ab0,0x6ff,&local_3ad8);
            std::__cxx11::string::~string((string *)&local_3ad8);
            std::allocator<char>::~allocator(&local_3ad9);
            std::__cxx11::string::~string((string *)&local_3ab0);
            std::allocator<char>::~allocator(&local_3ab1);
            std::__cxx11::string::~string((string *)&local_3a88);
            std::allocator<char>::~allocator(&local_3a89);
            abort();
          }
          p_Var6 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar7 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var6);
          spdlog::source_loc::source_loc
                    (&local_3af8,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,0x701,"initGeometryInParent");
          local_3b10.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = 0xa107c1;
          local_3b10.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = 0x17;
          fmt_01.str_.size_ = 0x17;
          fmt_01.str_.data_ = "Segment in {}: geo = {}";
          loc_04.line = local_3af8.line;
          loc_04._12_4_ = local_3af8._12_4_;
          loc_04.filename = local_3af8.filename;
          loc_04.funcname = local_3af8.funcname;
          spdlog::logger::log<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                    (peVar7,loc_04,trace,fmt_01,(RefEl *)((long)&parent_idx + 3),
                     (Matrix<double,__1,__1,_0,__1,__1> *)local_3340);
          std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                    (&local_3b10);
          std::
          unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
          ::operator=((unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
                       *)&local_358->rel_ref_geo_,
                      (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                       *)&local_3b10);
          std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                       *)&local_3b10);
        }
        else {
          if (child_entities_parent_info._4_4_ != 2) {
            std::__cxx11::stringstream::stringstream(local_4418);
            std::operator<<(local_4408,"Child of an edge can only be a point or a segment");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4438,"false",&local_4439);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4460,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_4461);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_4438,&local_4460,0x719,&local_4488);
            std::__cxx11::string::~string((string *)&local_4488);
            std::__cxx11::string::~string((string *)&local_4460);
            std::allocator<char>::~allocator(&local_4461);
            std::__cxx11::string::~string((string *)&local_4438);
            std::allocator<char>::~allocator(&local_4439);
            prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar19,"this code should not be reached");
            __cxa_throw(prVar19,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              (&pvVar14->child_point_idx,(ulong)local_5c8);
          if (*pvVar17 != child_pi._4_4_) {
            std::__cxx11::stringstream::stringstream(local_3c98);
            poVar18 = std::operator<<(local_3c88,"edge_child_info.child_point_idx.at(");
            poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_5c8);
            std::operator<<(poVar18," ) !== child_idx");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3cb8,
                       "parent_child_info.child_point_idx.at( child_number) == child_idx",
                       &local_3cb9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3ce0,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_3ce1);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_3cb8,&local_3ce0,0x70b,&local_3d08);
            std::__cxx11::string::~string((string *)&local_3d08);
            std::__cxx11::string::~string((string *)&local_3ce0);
            std::allocator<char>::~allocator(&local_3ce1);
            std::__cxx11::string::~string((string *)&local_3cb8);
            std::allocator<char>::~allocator(&local_3cb9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3d28,"false",&local_3d29);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3d50,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_3d51);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d78,"",&local_3d79)
            ;
            lf::base::AssertionFailed(&local_3d28,&local_3d50,0x70b,&local_3d78);
            std::__cxx11::string::~string((string *)&local_3d78);
            std::allocator<char>::~allocator(&local_3d79);
            std::__cxx11::string::~string((string *)&local_3d50);
            std::allocator<char>::~allocator(&local_3d51);
            std::__cxx11::string::~string((string *)&local_3d28);
            std::allocator<char>::~allocator(&local_3d29);
            abort();
          }
          iVar4 = (*pEStack_348->_vptr_Entity[4])();
          local_3d7a.type_ = (RefElType)iVar4;
          RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_3d7a);
          local_3d7b = lf::base::RefEl::kPoint();
          RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_3d7b);
          if (RVar2 != RVar3) {
            std::__cxx11::stringstream::stringstream(local_3f08);
            std::operator<<(local_3ef8,"Must be a point!");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3f28,"child_entity->RefEl() == lf::base::RefEl::kPoint()",
                       &local_3f29);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3f50,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_3f51);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_3f28,&local_3f50,0x70d,&local_3f78);
            std::__cxx11::string::~string((string *)&local_3f78);
            std::__cxx11::string::~string((string *)&local_3f50);
            std::allocator<char>::~allocator(&local_3f51);
            std::__cxx11::string::~string((string *)&local_3f28);
            std::allocator<char>::~allocator(&local_3f29);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3f98,"false",&local_3f99);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3fc0,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_3fc1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_3fe8,"",&local_3fe9)
            ;
            lf::base::AssertionFailed(&local_3f98,&local_3fc0,0x70d,&local_3fe8);
            std::__cxx11::string::~string((string *)&local_3fe8);
            std::allocator<char>::~allocator(&local_3fe9);
            std::__cxx11::string::~string((string *)&local_3fc0);
            std::allocator<char>::~allocator(&local_3fc1);
            std::__cxx11::string::~string((string *)&local_3f98);
            std::allocator<char>::~allocator(&local_3f99);
            abort();
          }
          IVar16 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                             ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                              local_3340);
          if (IVar16 != 1) {
            std::__cxx11::stringstream::stringstream(local_4178);
            std::operator<<(local_4168,"Only a single coordindate for a point!");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4198,"child_corners.cols() == 1",&local_4199);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_41c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_41c1);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_4198,&local_41c0,0x70f,&local_41e8);
            std::__cxx11::string::~string((string *)&local_41e8);
            std::__cxx11::string::~string((string *)&local_41c0);
            std::allocator<char>::~allocator(&local_41c1);
            std::__cxx11::string::~string((string *)&local_4198);
            std::allocator<char>::~allocator(&local_4199);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4208,"false",&local_4209);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4230,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                       ,&local_4231);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_4258,"",&local_4259)
            ;
            lf::base::AssertionFailed(&local_4208,&local_4230,0x70f,&local_4258);
            std::__cxx11::string::~string((string *)&local_4258);
            std::allocator<char>::~allocator(&local_4259);
            std::__cxx11::string::~string((string *)&local_4230);
            std::allocator<char>::~allocator(&local_4231);
            std::__cxx11::string::~string((string *)&local_4208);
            std::allocator<char>::~allocator(&local_4209);
            abort();
          }
          p_Var6 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   Logger();
          peVar7 = std::
                   __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var6);
          spdlog::source_loc::source_loc
                    (&local_4278,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,0x711,"initGeometryInParent");
          local_4290.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = 0xa108c5;
          local_4290.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = 0x15;
          fmt_00.str_.size_ = 0x15;
          fmt_00.str_.data_ = "Point in {}: geo = {}";
          loc_05.line = local_4278.line;
          loc_05._12_4_ = local_4278._12_4_;
          loc_05.filename = local_4278.filename;
          loc_05.funcname = local_4278.funcname;
          spdlog::logger::log<lf::base::RefEl_const&,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                    (peVar7,loc_05,trace,fmt_00,(RefEl *)((long)&parent_idx + 3),
                     (Matrix<double,__1,__1,_0,__1,__1> *)local_3340);
          std::make_unique<lf::geometry::Point,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                    (&local_4290);
          std::
          unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
          ::operator=((unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
                       *)&local_358->rel_ref_geo_,
                      (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                      &local_4290);
          std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::
          ~unique_ptr((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                      &local_4290);
        }
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_3340);
        std::
        vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
        ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                   *)local_2e40);
      }
      else {
        if (local_ab8 != 2) {
          std::__cxx11::stringstream::stringstream(local_4640);
          poVar18 = std::operator<<(local_4630,"Illegal parent co-dimension");
          std::ostream::operator<<(poVar18,local_ab8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4660,"false",&local_4661);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4688,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                     ,&local_4689);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_4660,&local_4688,0x727,&local_46b0);
          std::__cxx11::string::~string((string *)&local_46b0);
          std::__cxx11::string::~string((string *)&local_4688);
          std::allocator<char>::~allocator(&local_4689);
          std::__cxx11::string::~string((string *)&local_4660);
          std::allocator<char>::~allocator(&local_4661);
          prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar19,"this code should not be reached");
          __cxa_throw(prVar19,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        p_Var6 = (__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 Logger();
        peVar7 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var6);
        spdlog::source_loc::source_loc
                  (&local_44a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
                   ,0x721,"initGeometryInParent");
        local_44b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = 0xa109ab;
        local_44b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
             = 0xb;
        fmt.str_.size_ = 0xb;
        fmt.str_.data_ = "point in {}";
        loc_06.line = local_44a0.line;
        loc_06._12_4_ = local_44a0._12_4_;
        loc_06.filename = local_44a0.filename;
        loc_06.funcname = local_44a0.funcname;
        spdlog::logger::log<lf::base::RefEl_const&>
                  (peVar7,loc_06,trace,fmt,(RefEl *)((long)&parent_idx + 3));
        std::make_unique<lf::geometry::Point,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>(&local_44b8)
        ;
        std::
        unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>::
        operator=((unique_ptr<lf::geometry::Geometry_const,std::default_delete<lf::geometry::Geometry_const>>
                   *)&local_358->rel_ref_geo_,
                  (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                  &local_44b8);
        std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
                  ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                   &local_44b8);
      }
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end3);
    }
    child_entities_parent_info._4_4_ = child_entities_parent_info._4_4_ + 1;
  } while( true );
}

Assistant:

void MeshHierarchy::initGeometryInParent() {
  // number of meshes contained in the hierarchy
  const size_type num_levels = NumLevels();
  SPDLOG_LOGGER_DEBUG(Logger(),
                      "Entering MeshHierarchy::initGeometryInParent: {} levels",
                      num_levels);

  // Invoking this function makes sense only if the finest mesh has been
  // created by refinement.
  LF_ASSERT_MSG(num_levels > 1, "Must have been refined at least once");
  // Obtain references to finest and second finest mesh
  const lf::mesh::Mesh &parent_mesh{*meshes_.at(num_levels - 2)};
  const lf::mesh::Mesh &child_mesh{*meshes_.at(num_levels - 1)};
  // Partly intialized vectors of child information
  const std::vector<PointChildInfo> &pt_child_info{
      point_child_infos_.at(num_levels - 2)};
  std::vector<EdgeChildInfo> &ed_child_info{
      edge_child_infos_.at(num_levels - 2)};
  std::vector<CellChildInfo> &cell_child_info{
      cell_child_infos_.at(num_levels - 2)};
  // Dummy relative geometry for a point in a point
  const Eigen::MatrixXd nil_coords(0, 1);

  // Visit all entities of the fine mesh. Outer loop covers co-dimensions
  // starting with cells (codim = 0)
  for (dim_t codim = 0; codim <= 2; ++codim) {
    // Reference to ParentInfo vector for entities of co-dimension codim
    // of the new mesh
    std::vector<ParentInfo> &child_entities_parent_info(
        parent_infos_.back()[codim]);
    // Loop over all nodes of the new mesh (co-dimension = 2)
    for (const lf::mesh::Entity *child_entity : child_mesh.Entities(codim)) {
      // Obtain index of the child entity
      const glb_idx_t child_idx = child_mesh.Index(*child_entity);
      // Obtain ParentInfo for the current child entity
      ParentInfo &child_pi{child_entities_parent_info[child_idx]};
      LF_ASSERT_MSG(child_pi.rel_ref_geo_ == nullptr,
                    "No double initialization of rel_ref_geo_");
      // Get number of child
      const sub_idx_t child_number = child_pi.child_number;
      LF_ASSERT_MSG(child_number != idx_nil, "Child number missing");
      // Obtain parent entity
      LF_ASSERT_MSG(child_pi.parent_ptr != nullptr, "No valid parent pointer");
      const lf::mesh::Entity &parent{*child_pi.parent_ptr};
      // Obtain type of parent entity
      const lf::base::RefEl parent_ref_el(parent.RefEl());
      // Obtain co-dimension of parent entity
      const dim_t parent_codim = parent.Codim();
      // Index of parent entity
      const glb_idx_t parent_idx = parent_mesh.Index(parent);
      // Difference in co-dimensions
      LF_ASSERT_MSG(parent_codim <= codim, "Paren codim > child codim!");
      const dim_t child_rel_codim = codim - parent_codim;
      // Obtain local geometry of child. To that end we have to do
      // different things for different parent types
      switch (parent_codim) {
        case 0: {  // the parent entity is a cell
                   // Fetch refinement information
          const CellChildInfo &parent_child_info{cell_child_info[parent_idx]};
          const RefPat parent_ref_pat{parent_child_info.ref_pat_};
          const sub_idx_t anchor{parent_child_info.anchor_};
          // Obtain geometry of child
          const Hybrid2DRefinementPattern rp(parent_ref_el, parent_ref_pat,
                                             anchor);
          const std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>>
              child_polygon_vec{rp.ChildPolygons(child_rel_codim)};
          LF_ASSERT_MSG(child_number < child_polygon_vec.size(),
                        "Child number = " << child_number << " >= "
                                          << child_polygon_vec.size());
          const Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>
              &child_polygon{child_polygon_vec[child_number]};
          LF_ASSERT_MSG(child_polygon.rows() == 2,
                        "Need two coordinates in parent cell");
          // Matrix containing the relative reference coordinates of the
          // child's corners in its columns
          const Eigen::MatrixXd child_corners =
              child_polygon.cast<double>() /
              static_cast<double>(rp.LatticeConst());
          switch (codim) {
            case 0: {  // cell in cell
              LF_ASSERT_MSG(parent_child_info.child_cell_idx.at(child_number) ==
                                child_idx,
                            "parent_child_info.child_cell_idx.at("
                                << child_number << " ) !== child_idx");
              switch (child_corners.cols()) {
                case 3: {  // Child is a triangle
                  LF_ASSERT_MSG(
                      child_entity->RefEl() == lf::base::RefEl::kTria(),
                      "Must be triangle!");
                  SPDLOG_LOGGER_TRACE(Logger(), "Triangle in {}: geo = {}",
                                      parent_ref_el, child_corners);

                  child_pi.rel_ref_geo_ =
                      std::make_unique<lf::geometry::TriaO1>(child_corners);
                  break;
                }
                case 4: {  // Child is a quadrilateral
                  LF_ASSERT_MSG(
                      child_entity->RefEl() == lf::base::RefEl::kQuad(),
                      "Must be quad!");
                  SPDLOG_LOGGER_TRACE(Logger(), "Quad in {}: geo = {}",
                                      parent_ref_el, child_corners);

                  child_pi.rel_ref_geo_ =
                      std::make_unique<lf::geometry::QuadO1>(child_corners);
                  break;
                }
                default: {
                  LF_ASSERT_MSG(false, "Illegal number "
                                           << child_corners.cols()
                                           << " of corners for a child cell");
                  break;
                }
              }
              break;
            }
            case 1: {  // segment in cell, child_rel_codim = 1
              LF_ASSERT_MSG(parent_child_info.child_edge_idx.at(child_number) ==
                                child_idx,
                            "parent_child_info.child_edge_idx.at("
                                << child_number << " ) !== child_idx");
              LF_ASSERT_MSG(
                  child_entity->RefEl() == lf::base::RefEl::kSegment(),
                  "Must be an edge!");
              LF_ASSERT_MSG(child_corners.cols() == 2,
                            "Segement must have two endpoints");
              SPDLOG_LOGGER_TRACE(Logger(), "Segment in {}: geo = {}",
                                  parent_ref_el, child_corners);

              child_pi.rel_ref_geo_ =
                  std::make_unique<lf::geometry::SegmentO1>(child_corners);
              break;
            }
            case 2: {  // point in cell, child_rel_codim = 2
              LF_ASSERT_MSG(parent_child_info.child_point_idx.at(
                                child_number) == child_idx,
                            "parent_child_info.child_point_idx.at("
                                << child_number << " ) !== child_idx");
              LF_ASSERT_MSG(child_entity->RefEl() == lf::base::RefEl::kPoint(),
                            "Must be a point!");
              LF_ASSERT_MSG(child_corners.cols() == 1,
                            "Only a single coordindate for a point!");
              SPDLOG_LOGGER_TRACE(Logger(), "Point in {}: geo = {}",
                                  parent_ref_el, child_corners);

              child_pi.rel_ref_geo_ =
                  std::make_unique<lf::geometry::Point>(child_corners);
              break;
            }
            default:
              LF_VERIFY_MSG(false, "unexpected codim " << codim);
          }  // end switch codim
          break;
        }
        case 1: {  // the parent entity is an edge
                   // Fetch refinement information
          const EdgeChildInfo &parent_child_info{ed_child_info[parent_idx]};
          const RefPat parent_ref_pat{parent_child_info.ref_pat_};
          const sub_idx_t anchor{idx_nil};
          // Obtain geometry of child
          const Hybrid2DRefinementPattern rp(parent_ref_el, parent_ref_pat,
                                             anchor);
          const std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>>
              child_polygon_vec{rp.ChildPolygons(child_rel_codim)};
          LF_ASSERT_MSG(child_number < child_polygon_vec.size(),
                        "Child number = " << child_number << " >= "
                                          << child_polygon_vec.size());
          const Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>
              &child_polygon{child_polygon_vec[child_number]};
          LF_ASSERT_MSG(child_polygon.rows() == 1,
                        "Need one coordinate only in parent segment");
          // Row vector containing the relative reference coordinates of the
          // child's corners
          const Eigen::MatrixXd child_corners =
              child_polygon.cast<double>() /
              static_cast<double>(rp.LatticeConst());
          switch (codim) {
            case 1: {  // edge in edge, child_rel_codim = 0
              LF_ASSERT_MSG(parent_child_info.child_edge_idx.at(child_number) ==
                                child_idx,
                            "edge_child_info.child_edge_idx.at("
                                << child_number << " ) !== child_idx");
              LF_ASSERT_MSG(
                  child_entity->RefEl() == lf::base::RefEl::kSegment(),
                  "Must be an edge!");
              LF_ASSERT_MSG(child_corners.cols() == 2,
                            "Segement must have two endpoints");
              SPDLOG_LOGGER_TRACE(Logger(), "Segment in {}: geo = {}",
                                  parent_ref_el, child_corners);

              child_pi.rel_ref_geo_ =
                  std::make_unique<lf::geometry::SegmentO1>(child_corners);
              break;
            }
            case 2: {  // point in edge
              LF_ASSERT_MSG(parent_child_info.child_point_idx.at(
                                child_number) == child_idx,
                            "edge_child_info.child_point_idx.at("
                                << child_number << " ) !== child_idx");
              LF_ASSERT_MSG(child_entity->RefEl() == lf::base::RefEl::kPoint(),
                            "Must be a point!");
              LF_ASSERT_MSG(child_corners.cols() == 1,
                            "Only a single coordindate for a point!");
              SPDLOG_LOGGER_TRACE(Logger(), "Point in {}: geo = {}",
                                  parent_ref_el, child_corners);

              child_pi.rel_ref_geo_ =
                  std::make_unique<lf::geometry::Point>(child_corners);
              break;
            }
            default: {
              LF_VERIFY_MSG(
                  false, "Child of an edge can only be a point or a segment");
              break;
            }
          }  // end switch codim
          break;
        }
        case 2: {  // the parent entity is a point
          // No relative geometry for a point
          SPDLOG_LOGGER_TRACE(Logger(), "point in {}", parent_ref_el);
          child_pi.rel_ref_geo_ =
              std::make_unique<lf::geometry::Point>(nil_coords);
          break;
        }
        default: {
          LF_VERIFY_MSG(false, "Illegal parent co-dimension" << parent_codim);
          break;
        }
      }  // end switch(parent_codim)
    }  // end loop over entities of the fine mesh
  }  // end loop over codims
}